

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O0

void __thiscall classSHA256::finalize(classSHA256 *this,void *hash,size_t len)

{
  uint uVar1;
  uint32_t *__s;
  byte local_49;
  uint32_t _temp_4;
  uint8_t posn;
  uint32_t _temp_3;
  uint32_t _temp_2;
  uint32_t _temp_1;
  uint32_t _temp;
  uint8_t *wbytes;
  size_t len_local;
  void *hash_local;
  classSHA256 *this_local;
  
  __s = (this->state).w;
  if ((this->state).chunkSize < 0x38) {
    *(undefined1 *)((long)__s + (ulong)(this->state).chunkSize) = 0x80;
    memset((void *)((long)__s + (long)(int)(uint)(this->state).chunkSize + 1),0,
           (long)(int)(0x38 - ((this->state).chunkSize + 1)));
    uVar1 = (uint)((this->state).length >> 0x20);
    (this->state).w[0xe] =
         uVar1 >> 0x18 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (uint)(this->state).length;
    (this->state).w[0xf] =
         uVar1 >> 0x18 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    processChunk(this);
  }
  else {
    *(undefined1 *)((long)__s + (ulong)(this->state).chunkSize) = 0x80;
    memset((void *)((long)__s + (long)(int)(uint)(this->state).chunkSize + 1),0,
           (long)(int)(0x40 - ((this->state).chunkSize + 1)));
    processChunk(this);
    memset(__s,0,0x38);
    uVar1 = (uint)((this->state).length >> 0x20);
    (this->state).w[0xe] =
         uVar1 >> 0x18 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (uint)(this->state).length;
    (this->state).w[0xf] =
         uVar1 >> 0x18 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    processChunk(this);
  }
  for (local_49 = 0; local_49 < 8; local_49 = local_49 + 1) {
    uVar1 = (this->state).h[local_49];
    (this->state).w[local_49] =
         uVar1 >> 0x18 | uVar1 >> 8 & 0xff00 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  wbytes = (uint8_t *)len;
  if (0x20 < len) {
    wbytes = (uint8_t *)0x20;
  }
  memcpy(hash,(this->state).w,(size_t)wbytes);
  return;
}

Assistant:

void classSHA256::finalize(void *hash, size_t len)
{
    // Pad the last chunk.  We may need two padding chunks if there
    // isn't enough room in the first for the padding and length.
    uint8_t *wbytes = (uint8_t *)state.w;
    if (state.chunkSize <= (64 - 9)) {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - 8 - (state.chunkSize + 1));
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    } else {
        wbytes[state.chunkSize] = 0x80;
        memset(wbytes + state.chunkSize + 1, 0x00, 64 - (state.chunkSize + 1));
        processChunk();
        memset(wbytes, 0x00, 64 - 8);
        state.w[14] = htobe32((uint32_t)(state.length >> 32));
        state.w[15] = htobe32((uint32_t)state.length);
        processChunk();
    }

    // Convert the result into big endian and return it.
    for (uint8_t posn = 0; posn < 8; ++posn)
        state.w[posn] = htobe32(state.h[posn]);

    // Copy the hash to the caller's return buffer.
    if (len > 32)
        len = 32;
    memcpy(hash, state.w, len);
}